

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_test.cc
# Opt level: O2

void __thiscall leveldb::_Test_Randomized::_Run(_Test_Randomized *this)

{
  uint uVar1;
  int iVar2;
  uint32_t uVar3;
  ulong uVar4;
  undefined8 uVar5;
  uint uVar6;
  ulong uVar8;
  Random rnd;
  Slice local_a0;
  string v;
  string local_70;
  string local_50;
  ulong uVar7;
  
  uVar8 = 0;
  while (uVar8 != 0x10) {
    Harness::Init(&this->super_Harness,(TestArgs *)(kTestArgList + uVar8 * 0xc));
    iVar2 = test::RandomSeed();
    uVar4 = 0x7fffffff;
    rnd.seed_ = iVar2 + 5U & 0x7fffffff;
    if ((rnd.seed_ == 0x7fffffff) || (rnd.seed_ == 0)) {
      rnd.seed_ = 1;
    }
    uVar8 = uVar8 + 1;
    uVar7 = 0;
    while (uVar6 = (uint)uVar7, uVar6 < 2000) {
      uVar5 = CONCAT62((int6)(uVar4 >> 0x10),10);
      if ((ushort)((ushort)uVar7 % 10) == 0) {
        uVar5 = 0x10;
        fprintf(_stderr,"case %d of %d: num_entries = %d\n",uVar8 & 0xffffffff,0x10,uVar7);
      }
      while (iVar2 = (int)uVar7, uVar7 = (ulong)(iVar2 - 1), iVar2 != 0) {
        v._M_dataplus._M_p = (pointer)&v.field_2;
        v._M_string_length = 0;
        v.field_2._M_local_buf[0] = '\0';
        uVar3 = Random::Skewed(&rnd,4);
        test::RandomKey_abi_cxx11_(&local_50,(test *)&rnd,(Random *)(ulong)uVar3,(int)uVar5);
        uVar3 = Random::Skewed(&rnd,5);
        local_a0 = test::RandomString(&rnd,uVar3,&v);
        Slice::ToString_abi_cxx11_(&local_70,&local_a0);
        Harness::Add(&this->super_Harness,&local_50,&local_70);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&v);
      }
      Harness::Test(&this->super_Harness,&rnd);
      uVar1 = uVar6 + 1;
      if (0x31 < uVar6) {
        uVar1 = uVar6 + 200;
      }
      uVar4 = (ulong)uVar1;
      uVar7 = uVar4;
    }
  }
  return;
}

Assistant:

TEST(Harness, Randomized) {
  for (int i = 0; i < kNumTestArgs; i++) {
    Init(kTestArgList[i]);
    Random rnd(test::RandomSeed() + 5);
    for (int num_entries = 0; num_entries < 2000;
         num_entries += (num_entries < 50 ? 1 : 200)) {
      if ((num_entries % 10) == 0) {
        fprintf(stderr, "case %d of %d: num_entries = %d\n", (i + 1),
                int(kNumTestArgs), num_entries);
      }
      for (int e = 0; e < num_entries; e++) {
        std::string v;
        Add(test::RandomKey(&rnd, rnd.Skewed(4)),
            test::RandomString(&rnd, rnd.Skewed(5), &v).ToString());
      }
      Test(&rnd);
    }
  }
}